

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enums.cpp
# Opt level: O1

string * libcellml::cellmlElementTypeAsString_abi_cxx11_(CellmlElementType value)

{
  string *in_RDI;
  key_type local_c;
  
  std::
  map<libcellml::CellmlElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::CellmlElementType>,_std::allocator<std::pair<const_libcellml::CellmlElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::at((map<libcellml::CellmlElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::CellmlElementType>,_std::allocator<std::pair<const_libcellml::CellmlElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)cellmlElementTypeToString_abi_cxx11_,&local_c);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char*>();
  return in_RDI;
}

Assistant:

std::string cellmlElementTypeAsString(CellmlElementType value)
{
    return cellmlElementTypeToString.at(value);
}